

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void __thiscall MasterObjectHolder::MasterObjectHolder(MasterObjectHolder *this)

{
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  ::guarded<>(&this->brokers);
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
  ::guarded<>(&this->cores);
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::guarded<>(&this->feds);
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  ::guarded<>(&this->apps);
  gmlc::concurrency::TripWireDetector::TripWireDetector(&this->tripDetect);
  gmlc::libguarded::
  guarded<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  ::guarded<>(&this->errorStrings);
  return;
}

Assistant:

MasterObjectHolder::MasterObjectHolder() noexcept {}